

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

JavascriptString *
Js::RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString *flags,ScriptContext *scriptContext)

{
  Type *alloc;
  charcount_t cVar1;
  char16 *pcVar2;
  char16_t *pcVar3;
  undefined1 local_70 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  
  pcVar2 = JavascriptString::GetString(flags);
  pcVar3 = PAL_wcsstr(pcVar2,L"y");
  if (pcVar3 == (char16_t *)0x0) {
    bs._48_8_ = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
    alloc = &((TempArenaAllocatorObject *)bs._48_8_)->allocator;
    cVar1 = JavascriptString::GetLength(flags);
    StringBuilder<Memory::ArenaAllocator>::StringBuilder
              ((StringBuilder<Memory::ArenaAllocator> *)local_70,alloc,cVar1 + 1);
    cVar1 = JavascriptString::GetLength(flags);
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_70,pcVar2,cVar1);
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_70,L'y');
    pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach
                       ((StringBuilder<Memory::ArenaAllocator> *)local_70);
    flags = JavascriptString::NewCopyBuffer(pcVar2,bs.appendPtr._4_4_,scriptContext);
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,(TempArenaAllocatorObject *)bs._48_8_);
  }
  return flags;
}

Assistant:

JavascriptString* RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString* flags, ScriptContext* scriptContext)
    {
        const char16* flagsString = flags->GetString();
        if (wcsstr(flagsString, _u("y")) == nullptr)
        {
            BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("RegexHelper"))
            {
                StringBuilder<ArenaAllocator> bs(tempAlloc, flags->GetLength() + 1);
                bs.Append(flagsString, flags->GetLength());
                bs.Append(_u('y'));
                flags = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
            }
            END_TEMP_ALLOCATOR(tempAlloc, scriptContext);
        }

        return flags;
    }